

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void os_defext(char *fn,char *ext)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  char *p;
  char *local_18;
  
  sVar1 = strlen(in_RDI);
  local_18 = in_RDI + sVar1;
  while (in_RDI < local_18) {
    local_18 = local_18 + -1;
    if (*local_18 == '.') {
      return;
    }
    if ((*local_18 == '/') ||
       ((*local_18 != '\0' && (pcVar2 = strchr("",(int)*local_18), pcVar2 != (char *)0x0)))) break;
  }
  strcat(in_RDI,".");
  strcat(in_RDI,in_RSI);
  return;
}

Assistant:

void os_defext(char *fn, const char *ext)
{
    char *p;

    /* 
     *   Scan backwards from the end of the string, looking for the last
     *   dot ('.') in the filename.  Stop if we encounter a path separator
     *   character of some kind, because that means we reached the start
     *   of the filename without encountering a period.  
     */
    p = fn + strlen(fn);
    while (p > fn)
    {
        /* on to the previous character */
        p--;

        /* 
         *   if it's a period, return without doing anything - this
         *   filename already has an extension, so don't apply a default 
         */
        if (*p == '.')
            return;

        /* 
         *   if this is a path separator character, we're no longer in the
         *   filename, so stop looking for a period 
         */
        if (ispathchar(*p))
            break;
    }

    /* we didn't find an extension - add the dot and the extension */
    strcat(fn, ".");
    strcat(fn, ext);
}